

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Impl * kj::_::FiberStack::Impl::alloc(size_t stackSize,ucontext_t *context)

{
  SyscallResult SVar1;
  size_t sVar2;
  void *pvVar3;
  int *piVar4;
  Fault f_1;
  size_t stackSize_local;
  void *stack;
  ucontext_t *context_local;
  Fault f;
  void *stackMapping;
  size_t allocSize;
  UnwindDetector _kjUnwindDetector1414;
  
  context_local = context;
  sVar2 = getPageSize();
  pvVar3 = mmap((void *)0x0,stackSize + sVar2,0,0x22,-1,0);
  if (pvVar3 == (void *)0xffffffffffffffff) {
    piVar4 = __errno_location();
    Debug::Fault::Fault(&f,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                        ,0x582,*piVar4,"mmap(new stack)","");
    Debug::Fault::fatal(&f);
  }
  UnwindDetector::UnwindDetector(&_kjUnwindDetector1414);
  f.exception._0_1_ = 1;
  stack = (void *)((long)pvVar3 + sVar2);
  f_1.exception = (Exception *)&stack;
  SVar1 = Debug::syscall<kj::_::FiberStack::Impl::alloc(unsigned_long,ucontext_t*)::_lambda()_2_>
                    ((anon_class_16_2_8fad328a *)&f_1,false);
  pvVar3 = stack;
  if (SVar1.errorNumber == 0) {
    f_1.exception = (Exception *)&context_local;
    SVar1 = Debug::syscall<kj::_::FiberStack::Impl::alloc(unsigned_long,ucontext_t*)::_lambda()_3_>
                      ((anon_class_8_1_bc11688f *)&f_1,false);
    if (SVar1.errorNumber == 0) {
      (context_local->uc_stack).ss_size = stackSize - 400;
      (context_local->uc_stack).ss_sp = stack;
      (context_local->uc_stack).ss_flags = 0;
      context_local->uc_link = (ucontext_t *)0x0;
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:1412:5)>
      ::run((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1412:5)>
             *)&f);
      return (Impl *)((long)pvVar3 + (stackSize - 400));
    }
    Debug::Fault::Fault(&f_1,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                        ,0x59a,SVar1.errorNumber,"getcontext(context)","");
    Debug::Fault::fatal(&f_1);
  }
  Debug::Fault::Fault(&f_1,
                      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                      ,0x593,SVar1.errorNumber,"mprotect(stack, stackSize, PROT_READ | PROT_WRITE)",
                      "");
  Debug::Fault::fatal(&f_1);
}

Assistant:

static Impl* alloc(size_t stackSize, ucontext_t* context) {
#ifndef MAP_ANONYMOUS
#define MAP_ANONYMOUS MAP_ANON
#endif
    size_t pageSize = getPageSize();
    size_t allocSize = stackSize + pageSize;  // size plus guard page and impl

    // Allocate virtual address space for the stack but make it inaccessible initially.
    // TODO(someday): Does it make sense to use MAP_GROWSDOWN on Linux? It's a kind of bizarre flag
    //   that causes the mapping to automatically allocate extra pages (beyond the range specified)
    //   until it hits something... Note that on FreeBSD, MAP_STACK has the effect that
    //   MAP_GROWSDOWN has on Linux. (MAP_STACK, meanwhile, has no effect on Linux.)
    void* stackMapping = mmap(nullptr, allocSize, PROT_NONE,
        MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
    if (stackMapping == MAP_FAILED) {
      KJ_FAIL_SYSCALL("mmap(new stack)", errno);
    }
    KJ_ON_SCOPE_FAILURE({
      KJ_SYSCALL(munmap(stackMapping, allocSize)) { break; }
    });

#if __linux__
#if defined(PR_SET_VMA) && defined(PR_SET_VMA_ANON_NAME)
    // Try to name the virtual memory area for debugging purposes. This may fail if the kernel was
    // not configured with the CONFIG_ANON_VMA_NAME option.
    prctl(PR_SET_VMA, PR_SET_VMA_ANON_NAME, stackMapping, allocSize, "kj_fiber_stack");
#endif
#endif

    void* stack = reinterpret_cast<byte*>(stackMapping) + pageSize;
    // Now mark everything except the guard page as read-write. We assume the stack grows down, so
    // the guard page is at the beginning. No modern architecture uses stacks that grow up.
    KJ_SYSCALL(mprotect(stack, stackSize, PROT_READ | PROT_WRITE));

    // Stick `Impl` at the top of the stack.
    Impl* impl = (reinterpret_cast<Impl*>(reinterpret_cast<byte*>(stack) + stackSize) - 1);

    // Note: mmap() allocates zero'd pages so we don't have to memset() anything here.

    KJ_SYSCALL(getcontext(context));
#if __APPLE__ && __aarch64__
    // Per issue #1386, apple on arm64 zeros the entire configured stack.
    // But this is redundant, since we just allocated the stack with mmap() which
    // returns zero'd pages. Re-zeroing is both slow and results in prematurely
    // allocating pages we may not need -- it's normal for stacks to rely heavily
    // on lazy page allocation to avoid wasting memory. Instead, we lie:
    // we allocate the full size, but tell the ucontext the stack is the last
    // page only. This appears to work as no particular bounds checks or
    // anything are set up based on what we say here.
    context->uc_stack.ss_size = min(pageSize, stackSize) - sizeof(Impl);
    context->uc_stack.ss_sp = reinterpret_cast<char*>(stack) + stackSize - min(pageSize, stackSize);
#else
    context->uc_stack.ss_size = stackSize - sizeof(Impl);
    context->uc_stack.ss_sp = reinterpret_cast<char*>(stack);
#endif
    context->uc_stack.ss_flags = 0;
    // We don't use uc_link since our fiber start routine runs forever in a loop to allow for
    // reuse. When we're done with the fiber, we just destroy it, without switching to it's
    // stack. This is safe since the start routine doesn't allocate any memory or RAII objects
    // before looping.
    context->uc_link = 0;

    return impl;
  }